

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O3

natwm_error client_handle_destroy_notify(natwm_state *state,xcb_window_t window)

{
  natwm_error nVar1;
  workspace *pwVar2;
  client *client;
  
  pwVar2 = workspace_list_find_window_workspace(state->workspace_list,window);
  if (pwVar2 == (workspace *)0x0) {
    pwVar2 = workspace_list_get_focused(state->workspace_list);
    workspace_reset_focus(state,pwVar2);
  }
  else {
    client = workspace_find_window_client(pwVar2,window);
    if (client == (client *)0x0) {
      internal_logger(natwm_logger,LEVEL_WARNING,"Failed to find client during destroy");
      return NOT_FOUND_ERROR;
    }
    nVar1 = workspace_remove_client(state,pwVar2,client);
    if (nVar1 != NO_ERROR) {
      internal_logger(natwm_logger,LEVEL_WARNING,"Failed to remove client from workspace");
      return nVar1;
    }
    xcb_change_save_set(state->xcb,1,client->window);
    free(client->size_hints);
    free(client);
  }
  return NO_ERROR;
}

Assistant:

enum natwm_error client_handle_destroy_notify(struct natwm_state *state, xcb_window_t window)
{
        struct workspace *workspace
                = workspace_list_find_window_workspace(state->workspace_list, window);

        if (workspace == NULL) {
                // This window is not registered with us
                struct workspace *active_workspace
                        = workspace_list_get_focused(state->workspace_list);

                workspace_reset_focus(state, active_workspace);

                return NO_ERROR;
        }

        struct client *client = workspace_find_window_client(workspace, window);

        if (client == NULL) {
                LOG_WARNING(natwm_logger, "Failed to find client during destroy");

                return NOT_FOUND_ERROR;
        }

        enum natwm_error err = workspace_remove_client(state, workspace, client);

        if (err != NO_ERROR) {
                LOG_WARNING(natwm_logger, "Failed to remove client from workspace");

                return err;
        }

        xcb_change_save_set(state->xcb, XCB_SET_MODE_DELETE, client->window);

        client_destroy(client);

        return NO_ERROR;
}